

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O3

char * flatcc_json_parser_integer
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  
  if (buf != end) {
    uVar6 = (ulong)(*buf == '-');
    uVar5 = (uint)(*buf == '-');
    *value_sign = uVar5;
    if (buf + uVar6 == end) {
      uVar3 = 0;
      end = buf + uVar6;
    }
    else {
      uVar7 = ~(uint)buf;
      uVar9 = 0;
      pcVar1 = buf;
      uVar8 = 0;
      do {
        bVar4 = pcVar1[uVar6] - 0x30;
        if (9 < bVar4) {
          if (uVar6 == uVar9) {
            return buf;
          }
          uVar2 = (byte)pcVar1[uVar6] - 0x2e;
          pcVar10 = pcVar1 + uVar6;
          if ((uVar2 < 0x38) && ((0x80000000800001U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
            if (ctx->error != 0) {
              return end;
            }
            ctx->error = 0xc;
LAB_00124984:
            ctx->pos = (uVar5 - *(int *)&ctx->line_start) - uVar7;
            ctx->error_loc = pcVar1 + uVar6;
            return end;
          }
          goto LAB_0012493d;
        }
        uVar3 = (ulong)bVar4 + uVar8 * 10;
        if (uVar3 < uVar8) {
          if (ctx->error != 0) {
            return end;
          }
          ctx->error = 8;
          goto LAB_00124984;
        }
        pcVar10 = pcVar1 + uVar6 + 1;
        pcVar1 = pcVar1 + 1;
        uVar9 = uVar9 - 1;
        uVar7 = uVar7 - 1;
        uVar8 = uVar3;
      } while (pcVar10 != end);
    }
    pcVar10 = end;
    uVar8 = uVar3;
    if (end != buf) {
LAB_0012493d:
      buf = pcVar10;
      *value = uVar8;
    }
  }
  return buf;
}

Assistant:

const char *flatcc_json_parser_integer(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value)
{
    uint64_t x0, x = 0;
    const char *k;

    if (buf == end) {
        return buf;
    }
    k = buf;
    *value_sign = *buf == '-';
    buf += *value_sign;
    while (buf != end && *buf >= '0' && *buf <= '9') {
        x0 = x;
        x = x * 10 + (uint64_t)(*buf - '0');
        if (x0 > x) {
            return flatcc_json_parser_set_error(ctx, buf, end, value_sign ?
                    flatcc_json_parser_error_underflow : flatcc_json_parser_error_overflow);
        }
        ++buf;
    }
    if (buf == k) {
        /* Give up, but don't fail the parse just yet, it might be a valid symbol. */
        return buf;
    }
    if (buf != end && (*buf == 'e' || *buf == 'E' || *buf == '.')) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_float_unexpected);
    }
    *value = x;
    return buf;
}